

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O0

qnode_ptr_t create_node(int l,int r,int sizx,int sizy,int sizz,int ofst)

{
  qnode_ptr_t ptVar1;
  qnode_ptr_t p;
  int ofst_local;
  int sizz_local;
  int sizy_local;
  int sizx_local;
  int r_local;
  int l_local;
  
  ptVar1 = (qnode_ptr_t)malloc(0x170);
  ptVar1->res = r;
  ptVar1->sizx = sizx;
  ptVar1->sizy = sizy;
  ptVar1->sizz = sizz;
  ptVar1->ofst = ofst;
  ptVar1->level = l;
  return ptVar1;
}

Assistant:

qnode_ptr_t create_node(l,r,sizx,sizy,sizz,ofst)
int l, r, sizx, sizy, sizz, ofst ;

{ qnode_ptr_t p ;

  p = (qnode_ptr_t)malloc(sizeof(qnode_t)) ;
  p->res = r ;
  p->sizx = sizx ;
  p->sizy = sizy ;
  p->sizz = sizz ;
  p->ofst = ofst ;
  p->level = l ;
  return(p) ;
}